

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::ReadString(ON_BinaryArchive *this,ON_String *s)

{
  size_t count;
  bool bVar1;
  int iVar2;
  char *p;
  size_t string_utf8_element_count;
  size_t local_30;
  
  ON_String::Destroy(s);
  local_30 = 0;
  bVar1 = ReadStringUTF8ElementCount(this,&local_30);
  if (local_30 != 0 && bVar1) {
    iVar2 = (int)local_30;
    ON_String::ReserveArray(s,(long)iVar2);
    count = local_30;
    p = ON_String::Array(s);
    Read(this,count,p);
    ON_String::SetLength(s,(long)(iVar2 + -1));
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::ReadString( ON_String& s )
{
  s.Destroy();
  size_t string_utf8_element_count = 0;
  bool rc = ReadStringUTF8ElementCount( &string_utf8_element_count );
  if ( rc && string_utf8_element_count > 0 ) 
  {
    const int istring_utf8_element_count = (int)string_utf8_element_count; // (int) converts 64 bits size_t
    s.ReserveArray(istring_utf8_element_count);
    ReadString( string_utf8_element_count, s.Array() );
    s.SetLength( istring_utf8_element_count-1 );
  }
  return rc;
}